

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int mbedtls_sha256_ret(uchar *input,size_t ilen,uchar *output,int is224)

{
  int iVar1;
  undefined1 local_94 [8];
  mbedtls_sha256_context ctx;
  int ret;
  int is224_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.buffer[0x3c] = 0x92;
  ctx.buffer[0x3d] = 0xff;
  ctx.buffer[0x3e] = 0xff;
  ctx.buffer[0x3f] = 0xff;
  ctx.is224 = is224;
  mbedtls_sha256_init((mbedtls_sha256_context *)local_94);
  ctx.buffer._60_4_ = mbedtls_sha256_starts_ret((mbedtls_sha256_context *)local_94,ctx.is224);
  if ((ctx.buffer._60_4_ == 0) &&
     (ctx.buffer._60_4_ = mbedtls_sha256_update_ret((mbedtls_sha256_context *)local_94,input,ilen),
     ctx.buffer._60_4_ == 0)) {
    ctx.buffer._60_4_ = mbedtls_sha256_finish_ret((mbedtls_sha256_context *)local_94,output);
  }
  mbedtls_sha256_free((mbedtls_sha256_context *)local_94);
  iVar1._0_1_ = ctx.buffer[0x3c];
  iVar1._1_1_ = ctx.buffer[0x3d];
  iVar1._2_1_ = ctx.buffer[0x3e];
  iVar1._3_1_ = ctx.buffer[0x3f];
  return iVar1;
}

Assistant:

int mbedtls_sha256_ret( const unsigned char *input,
                        size_t ilen,
                        unsigned char output[32],
                        int is224 )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_sha256_context ctx;

    SHA256_VALIDATE_RET( is224 == 0 || is224 == 1 );
    SHA256_VALIDATE_RET( ilen == 0 || input != NULL );
    SHA256_VALIDATE_RET( (unsigned char *)output != NULL );

    mbedtls_sha256_init( &ctx );

    if( ( ret = mbedtls_sha256_starts_ret( &ctx, is224 ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha256_update_ret( &ctx, input, ilen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha256_finish_ret( &ctx, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_sha256_free( &ctx );

    return( ret );
}